

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# img.cpp
# Opt level: O1

bool __thiscall
tg::Img<glm::vec<3,_float,_(glm::qualifier)0>_>::save
          (Img<glm::vec<3,_float,_(glm::qualifier)0>_> *this,char *fileName,int quality)

{
  int x;
  int y;
  int iVar1;
  vec<3,_float,_(glm::qualifier)0> *data;
  byte bVar2;
  int iVar3;
  char *c;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  long lVar9;
  void *data_00;
  int iVar10;
  float fVar11;
  
  data = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._data;
  x = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._w;
  y = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._h;
  iVar1 = (this->super_ImgView<glm::vec<3,_float,_(glm::qualifier)0>_>)._stride;
  pcVar6 = (char *)0x0;
  for (pcVar4 = fileName; (pcVar7 = pcVar4, *pcVar4 == '.' || (pcVar7 = pcVar6, *pcVar4 != '\0'));
      pcVar4 = pcVar4 + 1) {
    pcVar6 = pcVar7;
  }
  if (pcVar6 == (char *)0x0) {
    iVar3 = 0;
  }
  else {
    bVar2 = (byte)(pcVar6[1] + 0x9eU) >> 1 | pcVar6[1] << 7;
    if (bVar2 < 10) {
      data_00 = (void *)0x0;
      if (((0x291U >> (bVar2 & 0x1f) & 1) != 0) &&
         (data_00 = operator_new__((long)(x * y * 3)), 0 < y)) {
        iVar3 = 0;
        iVar8 = 0;
        do {
          if (0 < x) {
            iVar10 = 0;
            do {
              lVar5 = (long)iVar8;
              iVar8 = iVar8 + 3;
              lVar9 = 0;
              do {
                fVar11 = powf((&data->field_0)[lVar5 + lVar9].x,0.45454544);
                *(char *)((long)data_00 + lVar9 + lVar5) = (char)(int)(fVar11 * 255.0);
                lVar9 = lVar9 + 1;
              } while ((int)lVar9 != 3);
              iVar10 = iVar10 + 1;
            } while (iVar10 != x);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 != y);
      }
    }
    else {
      data_00 = (void *)0x0;
    }
    iVar3 = 0;
    switch((int)pcVar6[1] - 0x62U >> 1 | (uint)(((int)pcVar6[1] - 0x62U & 1) != 0) << 0x1f) {
    case 0:
      iVar3 = stbi_write_bmp(fileName,x,y,3,data_00);
      break;
    case 3:
      iVar3 = stbi_write_hdr(fileName,x,y,3,(float *)data);
      break;
    case 4:
      iVar3 = stbi_write_jpg(fileName,x,y,3,data_00,quality);
      break;
    case 7:
      iVar3 = stbi_write_png(fileName,x,y,3,data_00,iVar1 * 3);
      break;
    case 9:
      iVar3 = stbi_write_tga(fileName,x,y,3,data_00);
    }
    if (data_00 != (void *)0x0) {
      operator_delete__(data_00);
    }
  }
  return iVar3 != 0;
}

Assistant:

bool Img<vec3>::save(const char* fileName, int quality)
{
    return saveImgFloatN<3>(fileName, _data, _w, _h, _stride, quality);
}